

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O1

void glu::sl::dumpValues(TestLog *log,
                        vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *values,
                        char *storageName,int arrayNdx)

{
  pointer pEVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  size_t sVar5;
  char *__s;
  DataType DVar6;
  long lVar7;
  ostringstream *this;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int elemNdx;
  ostringstream result;
  ulong local_398;
  uint local_390;
  float local_38c;
  ulong local_388;
  int local_37c;
  pointer local_378;
  uint local_36c;
  char *local_368;
  ulong local_360;
  long *local_358;
  long local_350;
  long local_348 [2];
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *local_338;
  TestLog *local_330;
  long local_328 [14];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [384];
  
  local_378 = (values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>)._M_impl.
              super__Vector_impl_data._M_start;
  if ((values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>)._M_impl.
      super__Vector_impl_data._M_finish != local_378) {
    uVar11 = 0;
    local_37c = arrayNdx;
    local_368 = storageName;
    local_338 = values;
    local_330 = log;
    do {
      pcVar8 = local_378[uVar11].name._M_dataplus._M_p;
      DVar6 = local_378[uVar11].type.m_data.basic.type;
      local_398 = (ulong)DVar6;
      iVar2 = getDataTypeScalarSize(DVar6);
      local_388 = CONCAT44(extraout_var,iVar2);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"    ",4);
      if (storageName == (char *)0x0) {
        std::ios::clear((int)&local_398 + (int)*(undefined8 *)(local_328[0] + -0x18) + 0x70);
      }
      else {
        sVar5 = strlen(storageName);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,storageName,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," ",1);
      __s = getDataTypeName((DataType)local_398);
      if (__s == (char *)0x0) {
        std::ios::clear((int)&local_398 + (int)*(undefined8 *)(local_328[0] + -0x18) + 0x70);
      }
      else {
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,__s,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," ",1);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)&local_398 + (int)*(undefined8 *)(local_328[0] + -0x18) + 0x70);
      }
      else {
        sVar5 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar8,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,":",1);
      uVar10 = local_398;
      lVar7 = 3;
      if ((uint)local_398 < 0x24) {
        if ((0x77003801cU >> (local_398 & 0x3f) & 1) == 0) {
          if ((0x888004002U >> (local_398 & 0x3f) & 1) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," ",1);
            if (((uint)local_398 < 0x23) && ((0x77003801cU >> (uVar10 & 0x3f) & 1) != 0))
            goto LAB_00a5de74;
          }
          goto LAB_00a5e0e4;
        }
LAB_00a5de74:
        pcVar8 = " [ ";
LAB_00a5de7b:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar8,lVar7);
      }
      else {
LAB_00a5e0e4:
        iVar2 = (int)local_398;
        pcVar8 = " [ ";
        if (iVar2 - 0x24U < 3) goto LAB_00a5de7b;
        lVar7 = 1;
        pcVar8 = "\n";
        if (iVar2 - 5U < 9 || iVar2 - 0x12U < 9) goto LAB_00a5de7b;
      }
      local_378 = local_378 + uVar11;
      DVar6 = (DataType)local_398;
      local_360 = uVar11;
      if (((DVar6 < TYPE_BOOL) && ((0x7f803c01eU >> (uVar10 & 0x3f) & 1) != 0)) ||
         (DVar6 - TYPE_BOOL < 4)) {
        if (0 < (int)local_388) {
          local_38c = (float)(DVar6 - TYPE_INT);
          local_390 = DVar6 - TYPE_UINT;
          local_36c = DVar6 - TYPE_BOOL;
          uVar11 = local_388 & 0xffffffff;
          iVar2 = (int)local_388 * local_37c;
          uVar10 = 0;
          do {
            pEVar1 = (local_378->elements).
                     super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar8 = ", ";
            if (uVar10 == 0) {
              pcVar8 = "";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328,pcVar8,(ulong)((uint)(uVar10 != 0) * 2));
            iVar3 = iVar2 + (int)uVar10;
            if (DVar6 - TYPE_FLOAT < 4) {
              std::ostream::_M_insert<double>((double)pEVar1[iVar3].float32);
            }
            else if ((uint)local_38c < 4) {
              std::ostream::operator<<((ostringstream *)local_328,pEVar1[iVar3].int32);
            }
            else if (local_390 < 4) {
              std::ostream::_M_insert<unsigned_long>((ulong)local_328);
            }
            else if (local_36c < 4) {
              pcVar8 = "true";
              if (pEVar1[iVar3].int32 == 0) {
                pcVar8 = "false";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,pcVar8,(ulong)(pEVar1[iVar3].int32 == 0) | 4);
            }
            uVar10 = uVar10 + 1;
          } while (uVar11 != uVar10);
        }
      }
      else if (DVar6 - TYPE_FLOAT_MAT2 < 9 || DVar6 - TYPE_DOUBLE_MAT2 < 9) {
        local_390 = getDataTypeMatrixNumRows(DVar6);
        uVar4 = getDataTypeMatrixNumColumns(DVar6);
        if (0 < (int)local_390) {
          local_388 = (ulong)(uint)((int)local_388 * local_37c);
          uVar9 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"       [ ",9);
            if (0 < (int)uVar4) {
              uVar11 = 0;
              do {
                local_38c = (local_378->elements).
                            super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                            ._M_impl.super__Vector_impl_data._M_start[(int)local_388 + (int)uVar11].
                            float32;
                pcVar8 = ", ";
                if (uVar11 == 0) {
                  pcVar8 = "";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_328,pcVar8,(ulong)((uint)(uVar11 != 0) * 2));
                std::ostream::_M_insert<double>((double)local_38c);
                uVar11 = uVar11 + 1;
              } while (uVar4 != uVar11);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," ]\n",3);
            uVar9 = uVar9 + 1;
            local_388 = local_388 + uVar4;
          } while (uVar9 != local_390);
        }
      }
      uVar11 = local_360;
      storageName = local_368;
      uVar4 = (int)local_398 - 1;
      if ((uVar4 < 0x23) && ((0x7fc01e00fU >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
        pcVar8 = &DAT_00bb7910 + *(int *)(&DAT_00bb7910 + (ulong)uVar4 * 4);
        lVar7 = *(long *)(&DAT_00bb79a0 + (ulong)uVar4 * 8);
LAB_00a5e00a:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar8,lVar7);
      }
      else {
        lVar7 = 3;
        pcVar8 = " ]\n";
        if ((int)local_398 - 0x24U < 3) goto LAB_00a5e00a;
      }
      this = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = local_330;
      std::__cxx11::ostringstream::ostringstream(this);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,(char *)local_358,local_350);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if (local_358 != local_348) {
        operator_delete(local_358,local_348[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(this);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
      std::ios_base::~ios_base(local_2b8);
      uVar11 = uVar11 + 1;
      local_378 = (local_338->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)(((long)(local_338->
                                     super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)local_378
                              >> 4) * -0x3333333333333333));
  }
  return;
}

Assistant:

static void dumpValues (tcu::TestLog& log, const vector<Value>& values, const char* storageName, int arrayNdx)
{
	for (size_t valNdx = 0; valNdx < values.size(); valNdx++)
		dumpValue(log, values[valNdx], storageName, arrayNdx);
}